

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::DefaultsTest::iterate(DefaultsTest *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *this_00;
  GLuint local_48;
  GLint i;
  int local_34;
  byte local_2f;
  byte local_2e;
  undefined1 local_2d;
  GLint max_attributes;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  DefaultsTest *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  max_attributes = (GLint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)max_attributes);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  local_2d = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)local_2d)) {
    local_2e = 1;
    local_2f = 0;
    local_34 = 8;
    (**(code **)(lStack_20 + 0x868))(0x8869,&local_34);
    err = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(err,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0xf6a);
    PrepareVAO(this);
    for (local_48 = 0; (int)local_48 < local_34; local_48 = local_48 + 1) {
      bVar1 = CheckIndexed(this,0x8622,local_48,0);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed(this,0x8623,local_48,4);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed(this,0x8624,local_48,0);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed(this,0x8625,local_48,0x1406);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed(this,0x886a,local_48,0);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed(this,0x88fd,local_48,0);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed(this,0x88fe,local_48,0);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed(this,0x874e,local_48,0);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed(this,0x82d5,local_48,0);
      local_2e = bVar1 & local_2e;
      bVar1 = CheckIndexed64(this,0x82d7,local_48,0);
      local_2e = (local_2e & 1 & bVar1) != 0;
    }
    bVar1 = Check(this,0x8895,0);
    local_2e = (local_2e & 1 & bVar1) != 0;
    if (this->m_vao != 0) {
      (**(code **)(lStack_20 + 0x490))(1);
      this->m_vao = 0;
    }
    do {
      iVar2 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar2 != 0);
    if ((local_2e & 1) == 0) {
      if ((local_2f & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult DefaultsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Test objects. */
	glw::GLint max_attributes = 8;

	try
	{
		/* Query limits. */
		gl.getIntegerv(GL_MAX_VERTEX_ATTRIBS, &max_attributes);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

		/* Prepare default Vertex Array Object. */
		PrepareVAO();

		/* Check default values per attribute index. */
		for (glw::GLint i = 0; i < max_attributes; ++i)
		{
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_ARRAY_ENABLED, i, GL_FALSE);
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_ARRAY_SIZE, i, 4);
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_ARRAY_STRIDE, i, 0);
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_ARRAY_TYPE, i, GL_FLOAT);
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, i, GL_FALSE);
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_ARRAY_INTEGER, i, GL_FALSE);
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_ARRAY_DIVISOR, i, 0);
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_ARRAY_LONG, i, GL_FALSE);
			is_ok &= CheckIndexed(GL_VERTEX_ATTRIB_RELATIVE_OFFSET, i, 0);
			is_ok &= CheckIndexed64(GL_VERTEX_BINDING_OFFSET, i, 0);
		}

		/* Check default values per vertex array object. */
		is_ok &= Check(GL_ELEMENT_ARRAY_BUFFER_BINDING, 0);
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	if (m_vao)
	{
		gl.deleteVertexArrays(1, &m_vao);

		m_vao = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}